

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetbios.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char **in_RSI;
  int in_EDI;
  int length;
  int result;
  char *source;
  int cnum;
  int c;
  uint8_t vbios [1048576];
  int in_stack_ffffffffffefffd0;
  int iVar3;
  char *pcVar4;
  char *__s1;
  int iVar5;
  uint8_t *in_stack_ffffffffffefffe8;
  int in_stack_ffffffffffeffff0;
  int in_stack_ffffffffffeffff4;
  uint uStack_4;
  
  iVar5 = 0;
  pcVar4 = (char *)0x0;
  iVar3 = 0;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    while (__s1 = pcVar4, iVar1 = getopt(in_EDI,in_RSI,"hc:s:"), iVar1 != -1) {
      if (iVar1 == 99) {
        __isoc99_sscanf(_optarg,"%d",&stack0xffffffffffefffe0);
        pcVar4 = __s1;
      }
      else if (iVar1 == 0x68) {
        usage(0);
        pcVar4 = __s1;
      }
      else {
        pcVar4 = _optarg;
        if (iVar1 != 0x73) {
          pcVar4 = __s1;
        }
      }
    }
    if (iVar5 < nva_cardsnum) {
      if (__s1 == (char *)0x0) {
        if (nva_cards[iVar5].chipset < 4) {
          __s1 = "PROM";
        }
        else {
          __s1 = "PRAMIN";
        }
        fprintf(_stderr,
                "No extraction method specified (using -s extraction_method). Defaulting to %s.\n",
                __s1);
      }
      iVar2 = strcasecmp(__s1,"pramin");
      if (iVar2 == 0) {
        iVar3 = vbios_extract_pramin
                          (in_stack_ffffffffffeffff0,in_stack_ffffffffffefffe8,
                           (int *)CONCAT44(iVar1,iVar5));
      }
      else {
        iVar2 = strcasecmp(__s1,"prom");
        if (iVar2 == 0) {
          iVar3 = vbios_extract_prom(in_stack_ffffffffffeffff4,in_stack_ffffffffffefffe8,
                                     (int *)CONCAT44(iVar1,iVar5));
        }
        else {
          fprintf(_stderr,"Unknown vbios extraction method.\n");
          usage(0);
        }
      }
      iVar1 = fileno(_stdout);
      iVar1 = isatty(iVar1);
      if (iVar1 == 0) {
        fwrite(&stack0xffffffffffefffe8,1,(long)in_stack_ffffffffffefffd0,_stdout);
      }
      else {
        fprintf(_stderr,
                "Refusing to write BIOS image to a terminal - please redirect output to a file.\n");
      }
      uStack_4 = (uint)(iVar3 != 1);
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      uStack_4 = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    uStack_4 = 1;
  }
  return uStack_4;
}

Assistant:

int main(int argc, char **argv) {
	uint8_t vbios[NV_PROM_SIZE];
	int c;
	int cnum =0;
	char const *source = NULL;
	int result = 0;
	int length;

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "hc:s:")) != -1) {
		switch (c) {
			case 'h':
				usage(0);
				break;
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 's':
				source = optarg;
				break;
		}
	}

	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	if (source == NULL) {
		if (nva_cards[cnum].chipset < 4)
			source = "PROM";
		else
			source = "PRAMIN";
		fprintf(stderr, "No extraction method specified (using -s extraction_method). Defaulting to %s.\n", source);
	}

	/* Extraction */
	if (strcasecmp(source, "pramin") == 0)
		result = vbios_extract_pramin(cnum, vbios, &length);
	else if (strcasecmp(source, "prom") == 0)
		result = vbios_extract_prom(cnum, vbios, &length);
	else {
		fprintf(stderr, "Unknown vbios extraction method.\n");
		usage(1);
	}

	if (isatty(fileno(stdout))) {
		fprintf(stderr, "Refusing to write BIOS image to a terminal - please redirect output to a file.\n");
	} else {
		/* print the vbios on stdout */
		fwrite(vbios, 1, length, stdout);
	}

	return result != EOK;
}